

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall leveldb::AddBoundaryInputsTest::~AddBoundaryInputsTest(AddBoundaryInputsTest *this)

{
  FileMetaData *this_00;
  size_type sVar1;
  reference ppFVar2;
  ulong local_18;
  size_t i;
  AddBoundaryInputsTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AddBoundaryInputsTest_001bb570;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (&this->all_files_);
    if (sVar1 <= local_18) break;
    ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](&this->all_files_,local_18);
    this_00 = *ppFVar2;
    if (this_00 != (FileMetaData *)0x0) {
      FileMetaData::~FileMetaData(this_00);
      operator_delete(this_00);
    }
    local_18 = local_18 + 1;
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear
            (&this->all_files_);
  InternalKeyComparator::~InternalKeyComparator(&this->icmp_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            (&this->all_files_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            (&this->compaction_files_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            (&this->level_files_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~AddBoundaryInputsTest() {
    for (size_t i = 0; i < all_files_.size(); ++i) {
      delete all_files_[i];
    }
    all_files_.clear();
  }